

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch.hpp
# Opt level: O3

shared_ptr<notch::core::ActivationLayer> __thiscall
notch::core::ActivationLayer::makeClone(ActivationLayer *this)

{
  _func_int **pp_Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  element_type *peVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  runtime_error *this_00;
  ActivationLayer *pAVar5;
  void *__child_stack;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  ActivationLayer *in_RSI;
  void *in_R8;
  shared_ptr<notch::core::ActivationLayer> sVar7;
  SharedBuffers local_38;
  
  (this->super_ABackpropLayer)._vptr_ABackpropLayer = (_func_int **)0x0;
  pAVar5 = in_RSI;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<notch::core::ActivationLayer,std::allocator<notch::core::ActivationLayer>,notch::core::ActivationLayer_const&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&(this->super_ABackpropLayer).shared,
             (ActivationLayer **)this,(allocator<notch::core::ActivationLayer> *)&local_38,in_RSI);
  if ((this->super_ABackpropLayer)._vptr_ABackpropLayer != (_func_int **)0x0) {
    SharedBuffers::clone
              (&local_38,(__fn *)&(in_RSI->super_ABackpropLayer).shared,__child_stack,(int)pAVar5,
               in_R8);
    _Var6._M_pi = local_38.inputBuffer.
                  super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi;
    peVar3 = local_38.inputBuffer.
             super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    pp_Var1 = (this->super_ABackpropLayer)._vptr_ABackpropLayer;
    local_38.inputBuffer.super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = (element_type *)0x0;
    local_38.inputBuffer.super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pp_Var1[2];
    pp_Var1[1] = (_func_int *)peVar3;
    pp_Var1[2] = (_func_int *)_Var6._M_pi;
    _Var6._M_pi = extraout_RDX;
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
      _Var6._M_pi = extraout_RDX_00;
    }
    _Var4._M_pi = local_38.outputBuffer.
                  super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi;
    peVar3 = local_38.outputBuffer.
             super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_38.outputBuffer.super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)0x0;
    local_38.outputBuffer.super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pp_Var1[4];
    pp_Var1[3] = (_func_int *)peVar3;
    pp_Var1[4] = (_func_int *)_Var4._M_pi;
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
      _Var6._M_pi = extraout_RDX_01;
    }
    if (local_38.outputBuffer.super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_38.outputBuffer.
                 super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
      _Var6._M_pi = extraout_RDX_02;
    }
    if (local_38.inputBuffer.super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_38.inputBuffer.
                 super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
      _Var6._M_pi = extraout_RDX_03;
    }
    sVar7.super___shared_ptr<notch::core::ActivationLayer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = _Var6._M_pi;
    sVar7.super___shared_ptr<notch::core::ActivationLayer,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this
    ;
    return (shared_ptr<notch::core::ActivationLayer>)
           sVar7.super___shared_ptr<notch::core::ActivationLayer,_(__gnu_cxx::_Lock_policy)2>;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  ::std::runtime_error::runtime_error(this_00,"cannot clone ActivationLayer");
  __cxa_throw(this_00,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

std::shared_ptr<ActivationLayer> makeClone() const {
        auto p = std::make_shared<ActivationLayer>(*this);
        if (!p) {
            throw std::runtime_error("cannot clone ActivationLayer");
        }
        p->shared = shared.clone();
        return p;
    }